

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitsOffset(ReflectionSchema *this)

{
  uint32 uVar1;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = this->has_bits_offset_;
  if (uVar1 == 0xffffffff) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.h"
               ,0xa6);
    other = LogMessage::operator<<(&local_48,"CHECK failed: HasHasbits(): ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
    uVar1 = this->has_bits_offset_;
  }
  return uVar1;
}

Assistant:

uint32 HasBitIndex(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bit_indices_[field->index()];
  }